

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BoxArray::uniqify(BoxArray *this)

{
  undefined8 uVar1;
  long lVar2;
  Long LVar3;
  Box *pBVar4;
  int iVar5;
  bool bVar6;
  IntVect IVar7;
  int i;
  int N;
  IntVect cr;
  shared_ptr<amrex::BARef> p;
  int dir;
  IntVect off;
  shared_ptr<amrex::BARef> *in_stack_fffffffffffffca8;
  BoxArray *in_stack_fffffffffffffcb0;
  int local_344;
  int in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  int local_334;
  int local_330;
  int local_32c;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  int local_320;
  int local_31c;
  int local_30c;
  int local_308;
  int local_304;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  bool local_271;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  int local_248;
  int local_22c;
  int iStack_228;
  int local_224;
  int local_220 [3];
  undefined8 local_210;
  int local_208;
  int *local_1e8;
  undefined8 *local_1e0;
  int local_1d8 [2];
  int local_1d0;
  IntVect local_1c4;
  int local_1b8 [2];
  int local_1b0;
  IntVect local_1a4;
  int local_198;
  IntVect local_194;
  int *local_188;
  Box *local_180;
  int local_174;
  IntVect *local_170;
  int local_164;
  int *local_160;
  undefined4 local_154;
  int *local_150;
  undefined4 local_144;
  int *local_140;
  undefined4 local_134;
  int *local_130;
  IntVect *local_128;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  IntVect *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  undefined4 local_e4;
  int *local_e0;
  int *local_d8;
  IntVect *local_d0;
  int *local_c8;
  IntVect *local_c0;
  int *local_b8;
  Box *local_b0;
  IndexType *local_a8;
  int local_9c;
  IndexType *local_98;
  undefined4 local_90;
  int local_8c;
  IntVect *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  lVar2 = std::__shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2> *)0xfb4538);
  if (lVar2 == 1) {
    clear_hash_bin(in_stack_fffffffffffffcb0);
  }
  else {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffcb0);
    std::make_shared<amrex::BARef,amrex::BARef&>
              ((BARef *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::swap<amrex::BARef>
              ((shared_ptr<amrex::BARef> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::shared_ptr<amrex::BARef>::~shared_ptr((shared_ptr<amrex::BARef> *)0xfb4594);
  }
  IVar7 = crseRatio((BoxArray *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  local_220[2] = IVar7.vect[2];
  local_208 = local_220[2];
  local_220._0_8_ = IVar7.vect._0_8_;
  local_210._0_4_ = local_220[0];
  local_210._4_4_ = local_220[1];
  local_220 = IVar7.vect;
  IntVect::IntVect(&local_1a4,1);
  local_1b0 = local_1a4.vect[2];
  local_1b8[0] = local_1a4.vect[0];
  local_1b8[1] = local_1a4.vect[1];
  local_22c = local_1a4.vect[0];
  iStack_228 = local_1a4.vect[1];
  uVar1 = _local_22c;
  local_224 = local_1a4.vect[2];
  local_1e0 = &local_210;
  local_1e8 = &local_22c;
  local_134 = 0;
  local_22c = local_1a4.vect[0];
  local_271 = true;
  if ((int)local_210 == local_22c) {
    local_144 = 1;
    iStack_228 = local_1a4.vect[1];
    local_271 = true;
    local_140 = local_1e8;
    if (local_210._4_4_ == iStack_228) {
      local_154 = 2;
      local_271 = local_208 != local_1a4.vect[2];
      local_150 = local_1e8;
    }
  }
  _local_22c = uVar1;
  local_130 = local_1e8;
  if (local_271) {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0xfb4751);
    LVar3 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                      ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0xfb4759);
    for (local_248 = 0; local_248 < (int)LVar3; local_248 = local_248 + 1) {
      std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0xfb4790);
      pBVar4 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                         ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                          in_stack_fffffffffffffcb0,(size_type)in_stack_fffffffffffffca8);
      local_188 = (int *)&local_210;
      local_e4 = 1;
      bVar6 = true;
      if (((int)local_210 == 1) && (bVar6 = true, local_210._4_4_ == 1)) {
        bVar6 = local_208 != 1;
      }
      local_180 = pBVar4;
      local_e0 = local_188;
      if (bVar6) {
        local_64 = (pBVar4->smallend).vect[0];
        local_68 = (int)local_210;
        local_60 = local_64;
        if ((int)local_210 != 1) {
          if ((int)local_210 == 2) {
            if (local_64 < 0) {
              iVar5 = local_64 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2ac = -iVar5 / 2 + -1;
            }
            else {
              local_2ac = local_64 / 2;
            }
            local_60 = local_2ac;
          }
          else if ((int)local_210 == 4) {
            if (local_64 < 0) {
              iVar5 = local_64 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2b0 = -iVar5 / 4 + -1;
            }
            else {
              local_2b0 = local_64 / 4;
            }
            local_60 = local_2b0;
          }
          else {
            if (local_64 < 0) {
              iVar5 = local_64 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2b4 = -iVar5 / (int)local_210 + -1;
            }
            else {
              local_2b4 = local_64 / (int)local_210;
            }
            local_60 = local_2b4;
          }
        }
        (pBVar4->smallend).vect[0] = local_60;
        local_70 = (pBVar4->smallend).vect[1];
        local_74 = local_210._4_4_;
        local_6c = local_70;
        if (local_210._4_4_ != 1) {
          if (local_210._4_4_ == 2) {
            if (local_70 < 0) {
              iVar5 = local_70 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2bc = -iVar5 / 2 + -1;
            }
            else {
              local_2bc = local_70 / 2;
            }
            local_6c = local_2bc;
          }
          else if (local_210._4_4_ == 4) {
            if (local_70 < 0) {
              iVar5 = local_70 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2c0 = -iVar5 / 4 + -1;
            }
            else {
              local_2c0 = local_70 / 4;
            }
            local_6c = local_2c0;
          }
          else {
            if (local_70 < 0) {
              iVar5 = local_70 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2c4 = -iVar5 / local_210._4_4_ + -1;
            }
            else {
              local_2c4 = local_70 / local_210._4_4_;
            }
            local_6c = local_2c4;
          }
        }
        (pBVar4->smallend).vect[1] = local_6c;
        local_7c = (pBVar4->smallend).vect[2];
        local_80 = local_208;
        local_78 = local_7c;
        if (local_208 != 1) {
          if (local_208 == 2) {
            if (local_7c < 0) {
              iVar5 = local_7c + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2cc = -iVar5 / 2 + -1;
            }
            else {
              local_2cc = local_7c / 2;
            }
            local_78 = local_2cc;
          }
          else if (local_208 == 4) {
            if (local_7c < 0) {
              iVar5 = local_7c + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2d0 = -iVar5 / 4 + -1;
            }
            else {
              local_2d0 = local_7c / 4;
            }
            local_78 = local_2d0;
          }
          else {
            if (local_7c < 0) {
              iVar5 = local_7c + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_2d4 = -iVar5 / local_208 + -1;
            }
            else {
              local_2d4 = local_7c / local_208;
            }
            local_78 = local_2d4;
          }
        }
        (pBVar4->smallend).vect[2] = local_78;
        local_a8 = &pBVar4->btype;
        local_b8 = local_188;
        local_b0 = pBVar4;
        if (local_a8->itype == 0) {
          local_c0 = &pBVar4->bigend;
          local_40 = local_c0->vect[0];
          local_44 = (int)local_210;
          local_3c = local_40;
          if ((int)local_210 != 1) {
            if ((int)local_210 == 2) {
              if (local_40 < 0) {
                iVar5 = local_40 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_31c = -iVar5 / 2 + -1;
              }
              else {
                local_31c = local_40 / 2;
              }
              local_3c = local_31c;
            }
            else if ((int)local_210 == 4) {
              if (local_40 < 0) {
                iVar5 = local_40 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_320 = -iVar5 / 4 + -1;
              }
              else {
                local_320 = local_40 / 4;
              }
              local_3c = local_320;
            }
            else if (local_40 < 0) {
              iVar5 = local_40 + 1;
              if (iVar5 < 1) {
                iVar5 = -iVar5;
              }
              local_3c = -iVar5 / (int)local_210 + -1;
            }
            else {
              local_3c = local_40 / (int)local_210;
            }
          }
          local_c0->vect[0] = local_3c;
          local_4c = (pBVar4->bigend).vect[1];
          local_50 = local_210._4_4_;
          local_48 = local_4c;
          if (local_210._4_4_ != 1) {
            if (local_210._4_4_ == 2) {
              if (local_4c < 0) {
                iVar5 = local_4c + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_32c = -iVar5 / 2 + -1;
              }
              else {
                local_32c = local_4c / 2;
              }
              local_48 = local_32c;
            }
            else if (local_210._4_4_ == 4) {
              if (local_4c < 0) {
                iVar5 = local_4c + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_330 = -iVar5 / 4 + -1;
              }
              else {
                local_330 = local_4c / 4;
              }
              local_48 = local_330;
            }
            else {
              if (local_4c < 0) {
                iVar5 = local_4c + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_334 = -iVar5 / local_210._4_4_ + -1;
              }
              else {
                local_334 = local_4c / local_210._4_4_;
              }
              local_48 = local_334;
            }
          }
          (pBVar4->bigend).vect[1] = local_48;
          local_58 = (pBVar4->bigend).vect[2];
          local_5c = local_208;
          local_54 = local_58;
          if (local_208 != 1) {
            if (local_208 == 2) {
              if (local_58 < 0) {
                iVar5 = local_58 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                in_stack_fffffffffffffcc4 = -iVar5 / 2 + -1;
                local_54 = in_stack_fffffffffffffcc4;
              }
              else {
                in_stack_fffffffffffffcc4 = local_58 / 2;
                local_54 = in_stack_fffffffffffffcc4;
              }
            }
            else if (local_208 == 4) {
              if (local_58 < 0) {
                iVar5 = local_58 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                in_stack_fffffffffffffcc0 = -iVar5 / 4 + -1;
                local_54 = in_stack_fffffffffffffcc0;
              }
              else {
                in_stack_fffffffffffffcc0 = local_58 / 4;
                local_54 = in_stack_fffffffffffffcc0;
              }
            }
            else {
              if (local_58 < 0) {
                iVar5 = local_58 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_344 = -iVar5 / local_208 + -1;
              }
              else {
                local_344 = local_58 / local_208;
              }
              local_54 = local_344;
            }
          }
          (pBVar4->bigend).vect[2] = local_54;
          local_c8 = local_188;
        }
        else {
          IntVect::IntVect(&local_194,0);
          for (local_198 = 0; local_198 < 3; local_198 = local_198 + 1) {
            local_98 = &pBVar4->btype;
            local_9c = local_198;
            local_14 = local_198;
            local_4 = local_198;
            if ((local_98->itype & 1 << ((byte)local_198 & 0x1f)) != 0) {
              local_170 = &pBVar4->bigend;
              local_174 = local_198;
              local_160 = local_188;
              local_164 = local_198;
              if (local_170->vect[local_198] % local_188[local_198] != 0) {
                local_88 = &local_194;
                local_8c = local_198;
                local_90 = 1;
                local_88->vect[local_198] = 1;
              }
            }
            local_10 = local_98;
          }
          local_d0 = &pBVar4->bigend;
          local_d8 = local_188;
          local_1c = local_d0->vect[0];
          local_20 = *local_188;
          local_18 = local_1c;
          if (local_20 != 1) {
            if (local_20 == 2) {
              if (local_1c < 0) {
                iVar5 = local_1c + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_2e4 = -iVar5 / 2 + -1;
              }
              else {
                local_2e4 = local_1c / 2;
              }
              local_18 = local_2e4;
            }
            else if (local_20 == 4) {
              if (local_1c < 0) {
                iVar5 = local_1c + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_2e8 = -iVar5 / 4 + -1;
              }
              else {
                local_2e8 = local_1c / 4;
              }
              local_18 = local_2e8;
            }
            else {
              if (local_1c < 0) {
                iVar5 = local_1c + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_2ec = -iVar5 / local_20 + -1;
              }
              else {
                local_2ec = local_1c / local_20;
              }
              local_18 = local_2ec;
            }
          }
          local_d0->vect[0] = local_18;
          local_28 = (pBVar4->bigend).vect[1];
          local_2c = local_188[1];
          local_24 = local_28;
          if (local_2c != 1) {
            if (local_2c == 2) {
              if (local_28 < 0) {
                iVar5 = local_28 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_2f4 = -iVar5 / 2 + -1;
              }
              else {
                local_2f4 = local_28 / 2;
              }
              local_24 = local_2f4;
            }
            else if (local_2c == 4) {
              if (local_28 < 0) {
                iVar5 = local_28 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_2f8 = -iVar5 / 4 + -1;
              }
              else {
                local_2f8 = local_28 / 4;
              }
              local_24 = local_2f8;
            }
            else {
              if (local_28 < 0) {
                iVar5 = local_28 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_2fc = -iVar5 / local_2c + -1;
              }
              else {
                local_2fc = local_28 / local_2c;
              }
              local_24 = local_2fc;
            }
          }
          (pBVar4->bigend).vect[1] = local_24;
          local_34 = (pBVar4->bigend).vect[2];
          local_38 = local_188[2];
          local_30 = local_34;
          if (local_38 != 1) {
            if (local_38 == 2) {
              if (local_34 < 0) {
                iVar5 = local_34 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_304 = -iVar5 / 2 + -1;
              }
              else {
                local_304 = local_34 / 2;
              }
              local_30 = local_304;
            }
            else if (local_38 == 4) {
              if (local_34 < 0) {
                iVar5 = local_34 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_308 = -iVar5 / 4 + -1;
              }
              else {
                local_308 = local_34 / 4;
              }
              local_30 = local_308;
            }
            else {
              if (local_34 < 0) {
                iVar5 = local_34 + 1;
                if (iVar5 < 1) {
                  iVar5 = -iVar5;
                }
                local_30c = -iVar5 / local_38 + -1;
              }
              else {
                local_30c = local_34 / local_38;
              }
              local_30 = local_30c;
            }
          }
          (pBVar4->bigend).vect[2] = local_30;
          local_120 = &pBVar4->bigend;
          local_128 = &local_194;
          local_f4 = 0;
          local_120->vect[0] = local_194.vect[0] + local_120->vect[0];
          local_104 = 1;
          (pBVar4->bigend).vect[1] = local_194.vect[1] + (pBVar4->bigend).vect[1];
          local_114 = 2;
          (pBVar4->bigend).vect[2] = local_194.vect[2] + (pBVar4->bigend).vect[2];
          local_110 = local_128;
          local_100 = local_128;
          local_f0 = local_128;
        }
      }
    }
    IntVect::IntVect(&local_1c4,1);
    local_1d0 = local_1c4.vect[2];
    local_1d8[0] = local_1c4.vect[0];
    local_1d8[1] = local_1c4.vect[1];
    BATransformer::set_coarsen_ratio
              ((BATransformer *)CONCAT44(local_1c4.vect[0],in_stack_fffffffffffffda8),
               (IntVect *)CONCAT44(in_stack_fffffffffffffda4,local_1c4.vect[2]));
  }
  std::__shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  return;
}

Assistant:

void
BoxArray::uniqify ()
{
    if (m_ref.use_count() == 1) {
        clear_hash_bin();
    } else {
        auto p = std::make_shared<BARef>(*m_ref);
        std::swap(m_ref,p);
    }
    IntVect cr = crseRatio();
    if (cr != IntVect::TheUnitVector()) {
        const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; i++) {
            m_ref->m_abox[i].coarsen(cr);
        }
        m_bat.set_coarsen_ratio(IntVect::TheUnitVector());
    }
    m_simplified_list.reset();
}